

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O3

TapBranch * __thiscall
cfd::core::DescriptorNode::GetTapBranch
          (TapBranch *__return_storage_ptr__,DescriptorNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *array_argument)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  pointer pbVar3;
  bool bVar4;
  int iVar5;
  _Rb_tree_node_base *p_Var6;
  ulong uVar7;
  mapped_type *this_00;
  pointer *ppuVar8;
  long *plVar9;
  long *plVar10;
  size_t sVar11;
  pointer pcVar12;
  pointer pbVar13;
  Script *object;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __i;
  long lVar14;
  key_type *pkVar15;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  key_list;
  string target;
  string desc;
  Script script;
  Script first_script;
  DescriptorKeyReference ref;
  SchnorrPubkey local_4d8;
  long lStack_4c0;
  DescriptorNode *local_4b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4a8;
  TapBranch *local_490;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_488;
  undefined1 *local_480;
  size_t local_478;
  undefined1 local_470 [16];
  string local_460;
  key_type *local_440;
  string local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  Script local_3f8;
  Script local_3b8;
  DescriptorScriptReference local_380;
  
  local_4a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var6 = (this->tree_node_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->tree_node_)._M_t._M_impl.super__Rb_tree_header;
  local_4b0 = this;
  local_488 = array_argument;
  if ((_Rb_tree_header *)p_Var6 != p_Var1) {
    do {
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string_const&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_4a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var6 + 1));
      p_Var6 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var6);
      pbVar3 = local_4a8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar13 = local_4a8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while ((_Rb_tree_header *)p_Var6 != p_Var1);
    if (local_4a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_4a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      lVar14 = (long)local_4a8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_4a8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      uVar7 = lVar14 >> 5;
      lVar2 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      ::std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<cfd::core::DescriptorNode::GetTapBranch(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>*)const::__0>>
                (local_4a8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_4a8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar14 < 0x201) {
        ::std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<cfd::core::DescriptorNode::GetTapBranch(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>*)const::__0>>
                  (pbVar13,pbVar3);
      }
      else {
        pkVar15 = (key_type *)(pbVar13 + 0x10);
        ::std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<cfd::core::DescriptorNode::GetTapBranch(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>*)const::__0>>
                  (pbVar13,pkVar15);
        for (; pkVar15 != (key_type *)pbVar3; pkVar15 = pkVar15 + 1) {
          ::std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Val_comp_iter<cfd::core::DescriptorNode::GetTapBranch(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>*)const::__0>>
                    (pkVar15);
        }
      }
    }
  }
  local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
  pcVar12 = (local_4b0->value_)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_460,pcVar12,pcVar12 + (local_4b0->value_)._M_string_length);
  local_480 = local_470;
  local_478 = 0;
  local_470[0] = 0;
  Script::Script(&local_3b8);
  local_440 = (key_type *)
              local_4a8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_490 = __return_storage_ptr__;
  if (local_4a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_4a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_4b0 = (DescriptorNode *)&local_4b0->tree_node_;
    pbVar13 = local_4a8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      this_00 = ::std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::DescriptorNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::DescriptorNode>_>_>
                ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::DescriptorNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::DescriptorNode>_>_>
                      *)local_4b0,(key_type *)pbVar13);
      if (this_00->node_type_ == kDescriptorTypeKey) {
        GetKeyReferences((DescriptorKeyReference *)&local_380,this_00,local_488);
        local_4d8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_4d8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_4d8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        uVar7 = (long)local_380.locking_script_.script_data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start -
                (long)local_380.locking_script_._vptr_Script;
        if (uVar7 == 0) {
          ppuVar8 = (pointer *)0x0;
          sVar11 = 0;
        }
        else {
          if ((long)uVar7 < 0) {
            ::std::__throw_bad_alloc();
          }
          ppuVar8 = (pointer *)operator_new(uVar7);
          sVar11 = (long)local_380.locking_script_.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start -
                   (long)local_380.locking_script_._vptr_Script;
        }
        local_4d8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)((long)ppuVar8 + uVar7);
        local_4d8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)ppuVar8;
        if ((_func_int **)
            local_380.locking_script_.script_data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != local_380.locking_script_._vptr_Script) {
          local_4d8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)ppuVar8;
          memmove(ppuVar8,local_380.locking_script_._vptr_Script,sVar11);
        }
        local_4d8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)((long)ppuVar8 + sVar11);
        SchnorrPubkey::GetHex_abi_cxx11_((string *)&local_3f8,&local_4d8);
        ::std::__cxx11::string::operator=((string *)&local_480,(string *)&local_3f8);
        __return_storage_ptr__ = local_490;
        if (local_3f8._vptr_Script !=
            (_func_int **)
            ((long)&local_3f8.script_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data + 8U)) {
          operator_delete(local_3f8._vptr_Script);
        }
        if ((pointer *)
            local_4d8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer *)0x0) {
          operator_delete(local_4d8.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        DescriptorKeyReference::~DescriptorKeyReference((DescriptorKeyReference *)&local_380);
      }
      else {
        GetReference(&local_380,this_00,local_488,(DescriptorNode *)0x0);
        bVar4 = Script::IsEmpty(&local_380.redeem_script_);
        object = &local_380.redeem_script_;
        if (bVar4) {
          object = &local_380.locking_script_;
        }
        Script::Script(&local_3f8,object);
        bVar4 = Script::IsEmpty(&local_3b8);
        if (bVar4) {
          Script::operator=(&local_3b8,&local_3f8);
        }
        Script::GetHex_abi_cxx11_(&local_438,&local_3f8);
        ::std::operator+(&local_418,"tl(",&local_438);
        plVar9 = (long *)::std::__cxx11::string::append((char *)&local_418);
        ppuVar8 = (pointer *)
                  ((long)&local_4d8.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data + 0x10);
        plVar10 = plVar9 + 2;
        if ((pointer *)*plVar9 == (pointer *)plVar10) {
          local_4d8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar10;
          lStack_4c0 = plVar9[3];
          local_4d8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)ppuVar8;
        }
        else {
          local_4d8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar10;
          local_4d8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)*plVar9;
        }
        local_4d8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)plVar9[1];
        *plVar9 = (long)plVar10;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        ::std::__cxx11::string::operator=((string *)&local_480,(string *)&local_4d8);
        if ((pointer *)
            local_4d8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != ppuVar8) {
          operator_delete(local_4d8.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418._M_dataplus._M_p != &local_418.field_2) {
          operator_delete(local_418._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438._M_dataplus._M_p != &local_438.field_2) {
          operator_delete(local_438._M_dataplus._M_p);
        }
        Script::~Script(&local_3f8);
        DescriptorScriptReference::~DescriptorScriptReference(&local_380);
      }
      sVar11 = ((key_type *)pbVar13)->_M_string_length;
      if (sVar11 == local_478) {
        if (sVar11 != 0) {
          pcVar12 = (((key_type *)pbVar13)->_M_dataplus)._M_p;
          iVar5 = bcmp(pcVar12,local_480,sVar11);
          if (iVar5 != 0) goto LAB_00190dcb;
        }
      }
      else {
        pcVar12 = (((key_type *)pbVar13)->_M_dataplus)._M_p;
LAB_00190dcb:
        while (uVar7 = ::std::__cxx11::string::find((char *)&local_460,(ulong)pcVar12,0),
              uVar7 != 0xffffffffffffffff) {
          ::std::__cxx11::string::replace
                    ((ulong)&local_460,uVar7,(char *)((key_type *)pbVar13)->_M_string_length,
                     (ulong)local_480);
          ::std::__cxx11::string::_M_assign((string *)&local_460);
          pcVar12 = (((key_type *)pbVar13)->_M_dataplus)._M_p;
        }
      }
      pbVar13 = (pointer)((key_type *)pbVar13 + 1);
    } while (pbVar13 != (pointer)local_440);
  }
  TapBranch::TapBranch(__return_storage_ptr__);
  if ((local_460._M_string_length != 0) &&
     (iVar5 = ::std::__cxx11::string::compare((char *)&local_460), iVar5 != 0)) {
    TapBranch::FromString((TapBranch *)&local_380,&local_460);
    TapBranch::operator=(__return_storage_ptr__,(TapBranch *)&local_380);
    TapBranch::~TapBranch((TapBranch *)&local_380);
    bVar4 = TapBranch::HasTapLeaf(__return_storage_ptr__);
    if ((!bVar4) && (bVar4 = Script::IsEmpty(&local_3b8), !bVar4)) {
      local_3f8._vptr_Script = (_func_int **)0x0;
      local_3f8.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_3f8.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      TapBranch::ChangeTapLeaf
                ((TapBranch *)&local_380,__return_storage_ptr__,&local_3b8,
                 (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                 &local_3f8);
      TapBranch::operator=(__return_storage_ptr__,(TapBranch *)&local_380);
      TapBranch::~TapBranch((TapBranch *)&local_380);
      ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                 &local_3f8);
    }
  }
  Script::~Script(&local_3b8);
  if (local_480 != local_470) {
    operator_delete(local_480);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != &local_460.field_2) {
    operator_delete(local_460._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4a8);
  return __return_storage_ptr__;
}

Assistant:

TapBranch DescriptorNode::GetTapBranch(
    std::vector<std::string>* array_argument) const {
  static auto sort_func = [](const std::string& src, const std::string& dest) {
    return src.length() > dest.length();
  };
  std::vector<std::string> key_list;
  for (const auto& tree_node : tree_node_) {
    key_list.emplace_back(tree_node.first);
  }
  std::sort(key_list.begin(), key_list.end(), sort_func);

  std::string desc = value_;
  std::string target;
  Script first_script;
  for (const auto& script_str : key_list) {
    const auto& node_ref = tree_node_.at(script_str);
    if (node_ref.node_type_ == DescriptorNodeType::kDescriptorTypeKey) {
      auto ref = node_ref.GetKeyReferences(array_argument);
      target = ref.GetSchnorrPubkey().GetHex();
    } else {
      const auto obj = node_ref.GetReference(array_argument);
      Script script = obj.HasRedeemScript() ? obj.GetRedeemScript()
                                            : obj.GetLockingScript();
      if (first_script.IsEmpty()) first_script = script;
      target = "tl(" + script.GetHex() + ")";
    }
    if (script_str != target) {
      auto offset = desc.find(script_str);
      while (offset != std::string::npos) {
        desc = desc.replace(offset, script_str.length(), target);
        offset = desc.find(script_str);
      }
    }
  }

  TapBranch tree;
  if (desc.empty() || (desc == "{}")) {
    // do nothing
  } else {
    tree = TapBranch::FromString(desc);
    if ((!tree.HasTapLeaf()) && (!first_script.IsEmpty())) {
      tree = tree.ChangeTapLeaf(first_script);
    }
  }
  return tree;
}